

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

void variance64_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m256i *vsse,
                    __m256i *vsum)

{
  int iVar1;
  bool bVar2;
  
  (*vsum)[0] = 0;
  (*vsum)[1] = 0;
  (*vsum)[2] = 0;
  (*vsum)[3] = 0;
  iVar1 = 0;
  if (0 < h) {
    iVar1 = h;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    variance32_kernel_avx2(src,ref,vsse,vsum);
    variance32_kernel_avx2(src + 0x20,ref + 0x20,vsse,vsum);
    src = src + src_stride;
    ref = ref + ref_stride;
  }
  return;
}

Assistant:

static inline void variance64_avx2(const uint8_t *src, const int src_stride,
                                   const uint8_t *ref, const int ref_stride,
                                   const int h, __m256i *const vsse,
                                   __m256i *const vsum) {
  *vsum = _mm256_setzero_si256();

  for (int i = 0; i < h; i++) {
    variance32_kernel_avx2(src + 0, ref + 0, vsse, vsum);
    variance32_kernel_avx2(src + 32, ref + 32, vsse, vsum);
    src += src_stride;
    ref += ref_stride;
  }
}